

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O2

int main(void)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> as_str;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_map;
  Roman_int rint;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"problem_6_test.txt",(allocator<char> *)&test_map);
  generate_test_file((string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"problem_6_test.txt",(allocator<char> *)&rint);
  read_test_file(&test_map,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  p_Var4 = test_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &test_map._M_t._M_impl.super__Rb_tree_header) {
      std::operator<<((ostream *)&std::cout,"Test passed\n");
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&test_map._M_t);
      return 0;
    }
    Roman_int::Roman_int(&rint,(string *)&p_Var4[1]._M_parent);
    _Var2 = Roman_int::as_int(&rint);
    _Var1 = p_Var4[1]._M_color;
    std::__cxx11::string::string((string *)&as_str,(string *)&p_Var4[1]._M_parent);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar3 = std::operator<<(local_1a8,(string *)&as_str);
    poVar3 = std::operator<<(poVar3," == ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    if (_Var1 != _Var2) break;
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&as_str);
    std::__cxx11::string::~string((string *)&rint);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  __assert_fail("(ss.str(), compare_with == as_int)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_2_input_and_output/ch_10/problem_6.cpp"
                ,0x18,"int main()");
}

Assistant:

int main()
{
	try
	{
		auto file_name{ "problem_6_test.txt" };
		generate_test_file(file_name);
		auto test_map = read_test_file(file_name);
		for (auto it = test_map.begin(); it != test_map.end(); ++it)
		{
			Roman_int rint{ it->second };
			auto as_int = rint.as_int();
			auto compare_with = it->first;
			auto as_str = it->second;
			std::stringstream ss;
			ss << as_str << " == " << as_int;
			assert((ss.str(), compare_with == as_int));
		}
		
		std::cout << "Test passed\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}